

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

nifti_image * nifti_make_new_nim(int *dims,int datatype,int data_fill)

{
  int iVar1;
  size_t __nmemb;
  nifti_1_header nhdr;
  nifti_1_header *__src;
  nifti_image *nim;
  void *pvVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  byte bVar6;
  undefined1 in_stack_fffffffffffffd28 [344];
  undefined8 local_178 [43];
  char local_20 [4];
  
  bVar6 = 0;
  __src = nifti_make_new_header(dims,datatype);
  if (__src != (nifti_1_header *)0x0) {
    memcpy(local_178,__src,0x15c);
    puVar4 = local_178;
    puVar5 = (undefined8 *)&stack0xfffffffffffffd28;
    for (lVar3 = 0x2b; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar5 = *puVar4;
      puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
    nhdr.magic[0] = local_20[0];
    nhdr.magic[1] = local_20[1];
    nhdr.magic[2] = local_20[2];
    nhdr.magic[3] = local_20[3];
    nhdr.sizeof_hdr = in_stack_fffffffffffffd28._0_4_;
    nhdr.data_type[0] = in_stack_fffffffffffffd28[4];
    nhdr.data_type[1] = in_stack_fffffffffffffd28[5];
    nhdr.data_type[2] = in_stack_fffffffffffffd28[6];
    nhdr.data_type[3] = in_stack_fffffffffffffd28[7];
    nhdr.data_type[4] = in_stack_fffffffffffffd28[8];
    nhdr.data_type[5] = in_stack_fffffffffffffd28[9];
    nhdr.data_type[6] = in_stack_fffffffffffffd28[10];
    nhdr.data_type[7] = in_stack_fffffffffffffd28[0xb];
    nhdr.data_type[8] = in_stack_fffffffffffffd28[0xc];
    nhdr.data_type[9] = in_stack_fffffffffffffd28[0xd];
    nhdr.db_name[0] = in_stack_fffffffffffffd28[0xe];
    nhdr.db_name[1] = in_stack_fffffffffffffd28[0xf];
    nhdr.db_name[2] = in_stack_fffffffffffffd28[0x10];
    nhdr.db_name[3] = in_stack_fffffffffffffd28[0x11];
    nhdr.db_name[4] = in_stack_fffffffffffffd28[0x12];
    nhdr.db_name[5] = in_stack_fffffffffffffd28[0x13];
    nhdr.db_name[6] = in_stack_fffffffffffffd28[0x14];
    nhdr.db_name[7] = in_stack_fffffffffffffd28[0x15];
    nhdr.db_name[8] = in_stack_fffffffffffffd28[0x16];
    nhdr.db_name[9] = in_stack_fffffffffffffd28[0x17];
    nhdr.db_name[10] = in_stack_fffffffffffffd28[0x18];
    nhdr.db_name[0xb] = in_stack_fffffffffffffd28[0x19];
    nhdr.db_name[0xc] = in_stack_fffffffffffffd28[0x1a];
    nhdr.db_name[0xd] = in_stack_fffffffffffffd28[0x1b];
    nhdr.db_name[0xe] = in_stack_fffffffffffffd28[0x1c];
    nhdr.db_name[0xf] = in_stack_fffffffffffffd28[0x1d];
    nhdr.db_name[0x10] = in_stack_fffffffffffffd28[0x1e];
    nhdr.db_name[0x11] = in_stack_fffffffffffffd28[0x1f];
    nhdr.extents = in_stack_fffffffffffffd28._32_4_;
    nhdr.session_error = in_stack_fffffffffffffd28._36_2_;
    nhdr.regular = in_stack_fffffffffffffd28[0x26];
    nhdr.dim_info = in_stack_fffffffffffffd28[0x27];
    nhdr.dim[0] = in_stack_fffffffffffffd28._40_2_;
    nhdr.dim[1] = in_stack_fffffffffffffd28._42_2_;
    nhdr.dim[2] = in_stack_fffffffffffffd28._44_2_;
    nhdr.dim[3] = in_stack_fffffffffffffd28._46_2_;
    nhdr.dim[4] = in_stack_fffffffffffffd28._48_2_;
    nhdr.dim[5] = in_stack_fffffffffffffd28._50_2_;
    nhdr.dim[6] = in_stack_fffffffffffffd28._52_2_;
    nhdr.dim[7] = in_stack_fffffffffffffd28._54_2_;
    nhdr.intent_p1 = (float)in_stack_fffffffffffffd28._56_4_;
    nhdr.intent_p2 = (float)in_stack_fffffffffffffd28._60_4_;
    nhdr.intent_p3 = (float)in_stack_fffffffffffffd28._64_4_;
    nhdr.intent_code = in_stack_fffffffffffffd28._68_2_;
    nhdr.datatype = in_stack_fffffffffffffd28._70_2_;
    nhdr.bitpix = in_stack_fffffffffffffd28._72_2_;
    nhdr.slice_start = in_stack_fffffffffffffd28._74_2_;
    nhdr.pixdim[0] = (float)in_stack_fffffffffffffd28._76_4_;
    nhdr.pixdim[1] = (float)in_stack_fffffffffffffd28._80_4_;
    nhdr.pixdim[2] = (float)in_stack_fffffffffffffd28._84_4_;
    nhdr.pixdim[3] = (float)in_stack_fffffffffffffd28._88_4_;
    nhdr.pixdim[4] = (float)in_stack_fffffffffffffd28._92_4_;
    nhdr.pixdim[5] = (float)in_stack_fffffffffffffd28._96_4_;
    nhdr.pixdim[6] = (float)in_stack_fffffffffffffd28._100_4_;
    nhdr.pixdim[7] = (float)in_stack_fffffffffffffd28._104_4_;
    nhdr.vox_offset = (float)in_stack_fffffffffffffd28._108_4_;
    nhdr.scl_slope = (float)in_stack_fffffffffffffd28._112_4_;
    nhdr.scl_inter = (float)in_stack_fffffffffffffd28._116_4_;
    nhdr.slice_end = in_stack_fffffffffffffd28._120_2_;
    nhdr.slice_code = in_stack_fffffffffffffd28[0x7a];
    nhdr.xyzt_units = in_stack_fffffffffffffd28[0x7b];
    nhdr.cal_max = (float)in_stack_fffffffffffffd28._124_4_;
    nhdr.cal_min = (float)in_stack_fffffffffffffd28._128_4_;
    nhdr.slice_duration = (float)in_stack_fffffffffffffd28._132_4_;
    nhdr.toffset = (float)in_stack_fffffffffffffd28._136_4_;
    nhdr.glmax = in_stack_fffffffffffffd28._140_4_;
    nhdr.glmin = in_stack_fffffffffffffd28._144_4_;
    nhdr.descrip[0] = in_stack_fffffffffffffd28[0x94];
    nhdr.descrip[1] = in_stack_fffffffffffffd28[0x95];
    nhdr.descrip[2] = in_stack_fffffffffffffd28[0x96];
    nhdr.descrip[3] = in_stack_fffffffffffffd28[0x97];
    nhdr.descrip[4] = in_stack_fffffffffffffd28[0x98];
    nhdr.descrip[5] = in_stack_fffffffffffffd28[0x99];
    nhdr.descrip[6] = in_stack_fffffffffffffd28[0x9a];
    nhdr.descrip[7] = in_stack_fffffffffffffd28[0x9b];
    nhdr.descrip[8] = in_stack_fffffffffffffd28[0x9c];
    nhdr.descrip[9] = in_stack_fffffffffffffd28[0x9d];
    nhdr.descrip[10] = in_stack_fffffffffffffd28[0x9e];
    nhdr.descrip[0xb] = in_stack_fffffffffffffd28[0x9f];
    nhdr.descrip[0xc] = in_stack_fffffffffffffd28[0xa0];
    nhdr.descrip[0xd] = in_stack_fffffffffffffd28[0xa1];
    nhdr.descrip[0xe] = in_stack_fffffffffffffd28[0xa2];
    nhdr.descrip[0xf] = in_stack_fffffffffffffd28[0xa3];
    nhdr.descrip[0x10] = in_stack_fffffffffffffd28[0xa4];
    nhdr.descrip[0x11] = in_stack_fffffffffffffd28[0xa5];
    nhdr.descrip[0x12] = in_stack_fffffffffffffd28[0xa6];
    nhdr.descrip[0x13] = in_stack_fffffffffffffd28[0xa7];
    nhdr.descrip[0x14] = in_stack_fffffffffffffd28[0xa8];
    nhdr.descrip[0x15] = in_stack_fffffffffffffd28[0xa9];
    nhdr.descrip[0x16] = in_stack_fffffffffffffd28[0xaa];
    nhdr.descrip[0x17] = in_stack_fffffffffffffd28[0xab];
    nhdr.descrip[0x18] = in_stack_fffffffffffffd28[0xac];
    nhdr.descrip[0x19] = in_stack_fffffffffffffd28[0xad];
    nhdr.descrip[0x1a] = in_stack_fffffffffffffd28[0xae];
    nhdr.descrip[0x1b] = in_stack_fffffffffffffd28[0xaf];
    nhdr.descrip[0x1c] = in_stack_fffffffffffffd28[0xb0];
    nhdr.descrip[0x1d] = in_stack_fffffffffffffd28[0xb1];
    nhdr.descrip[0x1e] = in_stack_fffffffffffffd28[0xb2];
    nhdr.descrip[0x1f] = in_stack_fffffffffffffd28[0xb3];
    nhdr.descrip[0x20] = in_stack_fffffffffffffd28[0xb4];
    nhdr.descrip[0x21] = in_stack_fffffffffffffd28[0xb5];
    nhdr.descrip[0x22] = in_stack_fffffffffffffd28[0xb6];
    nhdr.descrip[0x23] = in_stack_fffffffffffffd28[0xb7];
    nhdr.descrip[0x24] = in_stack_fffffffffffffd28[0xb8];
    nhdr.descrip[0x25] = in_stack_fffffffffffffd28[0xb9];
    nhdr.descrip[0x26] = in_stack_fffffffffffffd28[0xba];
    nhdr.descrip[0x27] = in_stack_fffffffffffffd28[0xbb];
    nhdr.descrip[0x28] = in_stack_fffffffffffffd28[0xbc];
    nhdr.descrip[0x29] = in_stack_fffffffffffffd28[0xbd];
    nhdr.descrip[0x2a] = in_stack_fffffffffffffd28[0xbe];
    nhdr.descrip[0x2b] = in_stack_fffffffffffffd28[0xbf];
    nhdr.descrip[0x2c] = in_stack_fffffffffffffd28[0xc0];
    nhdr.descrip[0x2d] = in_stack_fffffffffffffd28[0xc1];
    nhdr.descrip[0x2e] = in_stack_fffffffffffffd28[0xc2];
    nhdr.descrip[0x2f] = in_stack_fffffffffffffd28[0xc3];
    nhdr.descrip[0x30] = in_stack_fffffffffffffd28[0xc4];
    nhdr.descrip[0x31] = in_stack_fffffffffffffd28[0xc5];
    nhdr.descrip[0x32] = in_stack_fffffffffffffd28[0xc6];
    nhdr.descrip[0x33] = in_stack_fffffffffffffd28[199];
    nhdr.descrip[0x34] = in_stack_fffffffffffffd28[200];
    nhdr.descrip[0x35] = in_stack_fffffffffffffd28[0xc9];
    nhdr.descrip[0x36] = in_stack_fffffffffffffd28[0xca];
    nhdr.descrip[0x37] = in_stack_fffffffffffffd28[0xcb];
    nhdr.descrip[0x38] = in_stack_fffffffffffffd28[0xcc];
    nhdr.descrip[0x39] = in_stack_fffffffffffffd28[0xcd];
    nhdr.descrip[0x3a] = in_stack_fffffffffffffd28[0xce];
    nhdr.descrip[0x3b] = in_stack_fffffffffffffd28[0xcf];
    nhdr.descrip[0x3c] = in_stack_fffffffffffffd28[0xd0];
    nhdr.descrip[0x3d] = in_stack_fffffffffffffd28[0xd1];
    nhdr.descrip[0x3e] = in_stack_fffffffffffffd28[0xd2];
    nhdr.descrip[0x3f] = in_stack_fffffffffffffd28[0xd3];
    nhdr.descrip[0x40] = in_stack_fffffffffffffd28[0xd4];
    nhdr.descrip[0x41] = in_stack_fffffffffffffd28[0xd5];
    nhdr.descrip[0x42] = in_stack_fffffffffffffd28[0xd6];
    nhdr.descrip[0x43] = in_stack_fffffffffffffd28[0xd7];
    nhdr.descrip[0x44] = in_stack_fffffffffffffd28[0xd8];
    nhdr.descrip[0x45] = in_stack_fffffffffffffd28[0xd9];
    nhdr.descrip[0x46] = in_stack_fffffffffffffd28[0xda];
    nhdr.descrip[0x47] = in_stack_fffffffffffffd28[0xdb];
    nhdr.descrip[0x48] = in_stack_fffffffffffffd28[0xdc];
    nhdr.descrip[0x49] = in_stack_fffffffffffffd28[0xdd];
    nhdr.descrip[0x4a] = in_stack_fffffffffffffd28[0xde];
    nhdr.descrip[0x4b] = in_stack_fffffffffffffd28[0xdf];
    nhdr.descrip[0x4c] = in_stack_fffffffffffffd28[0xe0];
    nhdr.descrip[0x4d] = in_stack_fffffffffffffd28[0xe1];
    nhdr.descrip[0x4e] = in_stack_fffffffffffffd28[0xe2];
    nhdr.descrip[0x4f] = in_stack_fffffffffffffd28[0xe3];
    nhdr.aux_file[0] = in_stack_fffffffffffffd28[0xe4];
    nhdr.aux_file[1] = in_stack_fffffffffffffd28[0xe5];
    nhdr.aux_file[2] = in_stack_fffffffffffffd28[0xe6];
    nhdr.aux_file[3] = in_stack_fffffffffffffd28[0xe7];
    nhdr.aux_file[4] = in_stack_fffffffffffffd28[0xe8];
    nhdr.aux_file[5] = in_stack_fffffffffffffd28[0xe9];
    nhdr.aux_file[6] = in_stack_fffffffffffffd28[0xea];
    nhdr.aux_file[7] = in_stack_fffffffffffffd28[0xeb];
    nhdr.aux_file[8] = in_stack_fffffffffffffd28[0xec];
    nhdr.aux_file[9] = in_stack_fffffffffffffd28[0xed];
    nhdr.aux_file[10] = in_stack_fffffffffffffd28[0xee];
    nhdr.aux_file[0xb] = in_stack_fffffffffffffd28[0xef];
    nhdr.aux_file[0xc] = in_stack_fffffffffffffd28[0xf0];
    nhdr.aux_file[0xd] = in_stack_fffffffffffffd28[0xf1];
    nhdr.aux_file[0xe] = in_stack_fffffffffffffd28[0xf2];
    nhdr.aux_file[0xf] = in_stack_fffffffffffffd28[0xf3];
    nhdr.aux_file[0x10] = in_stack_fffffffffffffd28[0xf4];
    nhdr.aux_file[0x11] = in_stack_fffffffffffffd28[0xf5];
    nhdr.aux_file[0x12] = in_stack_fffffffffffffd28[0xf6];
    nhdr.aux_file[0x13] = in_stack_fffffffffffffd28[0xf7];
    nhdr.aux_file[0x14] = in_stack_fffffffffffffd28[0xf8];
    nhdr.aux_file[0x15] = in_stack_fffffffffffffd28[0xf9];
    nhdr.aux_file[0x16] = in_stack_fffffffffffffd28[0xfa];
    nhdr.aux_file[0x17] = in_stack_fffffffffffffd28[0xfb];
    nhdr.qform_code = in_stack_fffffffffffffd28._252_2_;
    nhdr.sform_code = in_stack_fffffffffffffd28._254_2_;
    nhdr.quatern_b = (float)in_stack_fffffffffffffd28._256_4_;
    nhdr.quatern_c = (float)in_stack_fffffffffffffd28._260_4_;
    nhdr.quatern_d = (float)in_stack_fffffffffffffd28._264_4_;
    nhdr.qoffset_x = (float)in_stack_fffffffffffffd28._268_4_;
    nhdr.qoffset_y = (float)in_stack_fffffffffffffd28._272_4_;
    nhdr.qoffset_z = (float)in_stack_fffffffffffffd28._276_4_;
    nhdr.srow_x[0] = (float)in_stack_fffffffffffffd28._280_4_;
    nhdr.srow_x[1] = (float)in_stack_fffffffffffffd28._284_4_;
    nhdr.srow_x[2] = (float)in_stack_fffffffffffffd28._288_4_;
    nhdr.srow_x[3] = (float)in_stack_fffffffffffffd28._292_4_;
    nhdr.srow_y[0] = (float)in_stack_fffffffffffffd28._296_4_;
    nhdr.srow_y[1] = (float)in_stack_fffffffffffffd28._300_4_;
    nhdr.srow_y[2] = (float)in_stack_fffffffffffffd28._304_4_;
    nhdr.srow_y[3] = (float)in_stack_fffffffffffffd28._308_4_;
    nhdr.srow_z[0] = (float)in_stack_fffffffffffffd28._312_4_;
    nhdr.srow_z[1] = (float)in_stack_fffffffffffffd28._316_4_;
    nhdr.srow_z[2] = (float)in_stack_fffffffffffffd28._320_4_;
    nhdr.srow_z[3] = (float)in_stack_fffffffffffffd28._324_4_;
    nhdr.intent_name[0] = in_stack_fffffffffffffd28[0x148];
    nhdr.intent_name[1] = in_stack_fffffffffffffd28[0x149];
    nhdr.intent_name[2] = in_stack_fffffffffffffd28[0x14a];
    nhdr.intent_name[3] = in_stack_fffffffffffffd28[0x14b];
    nhdr.intent_name[4] = in_stack_fffffffffffffd28[0x14c];
    nhdr.intent_name[5] = in_stack_fffffffffffffd28[0x14d];
    nhdr.intent_name[6] = in_stack_fffffffffffffd28[0x14e];
    nhdr.intent_name[7] = in_stack_fffffffffffffd28[0x14f];
    nhdr.intent_name[8] = in_stack_fffffffffffffd28[0x150];
    nhdr.intent_name[9] = in_stack_fffffffffffffd28[0x151];
    nhdr.intent_name[10] = in_stack_fffffffffffffd28[0x152];
    nhdr.intent_name[0xb] = in_stack_fffffffffffffd28[0x153];
    nhdr.intent_name[0xc] = in_stack_fffffffffffffd28[0x154];
    nhdr.intent_name[0xd] = in_stack_fffffffffffffd28[0x155];
    nhdr.intent_name[0xe] = in_stack_fffffffffffffd28[0x156];
    nhdr.intent_name[0xf] = in_stack_fffffffffffffd28[0x157];
    nim = nifti_convert_nhdr2nim(nhdr,(char *)0x0);
    free(__src);
    if (nim == (nifti_image *)0x0) {
      nifti_make_new_nim_cold_1();
    }
    else {
      if (1 < g_opts_0) {
        fprintf(_stderr,"+d nifti_make_new_nim, data_fill = %d\n",(ulong)(uint)data_fill);
      }
      if (data_fill == 0) {
        return nim;
      }
      __nmemb = nim->nvox;
      iVar1 = nim->nbyper;
      pvVar2 = calloc(__nmemb,(long)iVar1);
      nim->data = pvVar2;
      if (pvVar2 != (void *)0x0) {
        return nim;
      }
      fprintf(_stderr,"** NMNN: failed to alloc %u bytes for data\n",
              (ulong)(uint)(iVar1 * (int)__nmemb));
      nifti_image_free(nim);
    }
  }
  return (nifti_image *)0x0;
}

Assistant:

nifti_image * nifti_make_new_nim(const int dims[], int datatype, int data_fill)
{
   nifti_image    * nim;
   nifti_1_header * nhdr;

   nhdr = nifti_make_new_header(dims, datatype);
   if( !nhdr ) return NULL;  /* error already printed */

   nim = nifti_convert_nhdr2nim(*nhdr,NULL);
   free(nhdr);               /* in any case, we are done with this */
   if( !nim ){
      fprintf(stderr,"** NMNN: nifti_convert_nhdr2nim failure\n");
      return NULL;
   }

   if( g_opts.debug > 1 )
      fprintf(stderr,"+d nifti_make_new_nim, data_fill = %d\n",data_fill);

   if( data_fill ) {
      nim->data = calloc(nim->nvox, nim->nbyper);

      /* if we cannot allocate data, take ball and go home */
      if( !nim->data ) {
         fprintf(stderr,"** NMNN: failed to alloc %u bytes for data\n",
                 (unsigned)(nim->nvox*nim->nbyper));
         nifti_image_free(nim);
         nim = NULL;
      }
   }

   return nim;
}